

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

FP32 tinyexr::half_to_float(FP16 h)

{
  uint uVar1;
  float fVar2;
  uint uVar3;
  
  uVar1 = (int)h << 0xd & 0xfffe000;
  uVar3 = (int)h << 0xd & 0xf800000;
  if (uVar3 == 0xf800000) {
    fVar2 = (float)(uVar1 | 0x70000000);
  }
  else if (uVar3 == 0) {
    fVar2 = (float)(uVar1 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar2 = (float)(uVar1 + 0x38000000);
  }
  return (FP32)(((uint)h & 0x8000) << 0x10 | (uint)fVar2);
}

Assistant:

static FP32 half_to_float(FP16 h) {
  static const FP32 magic = {113 << 23};
  static const unsigned int shifted_exp = 0x7c00
                                          << 13;  // exponent mask after shift
  FP32 o;

  o.u = (h.u & 0x7fffU) << 13U;           // exponent/mantissa bits
  unsigned int exp_ = shifted_exp & o.u;  // just the exponent
  o.u += (127 - 15) << 23;                // exponent adjust

  // handle exponent special cases
  if (exp_ == shifted_exp)    // Inf/NaN?
    o.u += (128 - 16) << 23;  // extra exp adjust
  else if (exp_ == 0)         // Zero/Denormal?
  {
    o.u += 1 << 23;  // extra exp adjust
    o.f -= magic.f;  // renormalize
  }

  o.u |= (h.u & 0x8000U) << 16U;  // sign bit
  return o;
}